

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.hpp
# Opt level: O0

void __thiscall clara::detail::BasicResult<void>::enforceOk(BasicResult<void> *this)

{
  BasicResult<void> *this_local;
  
  if ((this->super_ResultValueBase<void>).super_ResultBase.m_type == LogicError) {
    __assert_fail("m_type != ResultBase::LogicError",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Tests/FuzzTests/clara.hpp"
                  ,0x252,"virtual void clara::detail::BasicResult<>::enforceOk() const [T = void]");
  }
  if ((this->super_ResultValueBase<void>).super_ResultBase.m_type != RuntimeError) {
    if ((this->super_ResultValueBase<void>).super_ResultBase.m_type != Ok) {
      abort();
    }
    return;
  }
  __assert_fail("m_type != ResultBase::RuntimeError",
                "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Tests/FuzzTests/clara.hpp"
                ,0x253,"virtual void clara::detail::BasicResult<>::enforceOk() const [T = void]");
}

Assistant:

void enforceOk() const override {

            // Errors shouldn't reach this point, but if they do
            // the actual error message will be in m_errorMessage
            assert( m_type != ResultBase::LogicError );
            assert( m_type != ResultBase::RuntimeError );
            if( m_type != ResultBase::Ok )
                std::abort();
        }